

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

cueify_msf_t cueify_full_toc_get_track_address(cueify_full_toc *t,uint8_t track)

{
  cueify_msf_t local_30;
  cueify_msf_t zero;
  cueify_full_toc_private *toc;
  uint8_t track_local;
  cueify_full_toc *t_local;
  
  if (t == (cueify_full_toc *)0x0) {
    t_local._5_2_ = 0;
    t_local._7_1_ = '\0';
  }
  else if ((track < *(byte *)((long)t + 2)) || (*(byte *)((long)t + 3) < track)) {
    t_local._5_2_ = 0;
    t_local._7_1_ = '\0';
  }
  else {
    t_local._5_2_ = *(undefined2 *)((long)t + (ulong)track * 9 + 10);
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)track * 9 + 0xc);
  }
  local_30.frm = t_local._7_1_;
  local_30.min = t_local._5_1_;
  local_30.sec = t_local._6_1_;
  return local_30;
}

Assistant:

cueify_msf_t cueify_full_toc_get_track_address(cueify_full_toc *t,
					       uint8_t track) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t zero;

    zero.min = 0;
    zero.sec = 0;
    zero.frm = 0;

    if (toc == NULL) {
	return zero;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].offset;
    } else {
	return zero;
    }
}